

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O0

int CVodeWFtolerances(void *cvode_mem,CVEwtFn efun)

{
  CVEwtFn in_RSI;
  CVodeMem in_RDI;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x310,"CVodeWFtolerances",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->cv_MallocDone == 0) {
    cvProcessError(in_RDI,-0x17,0x317,"CVodeWFtolerances",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode.c"
                   ,"Attempt to call before CVodeInit.");
    local_4 = -0x17;
  }
  else {
    in_RDI->cv_itol = 3;
    in_RDI->cv_user_efun = 1;
    in_RDI->cv_efun = in_RSI;
    in_RDI->cv_e_data = (void *)0x0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeWFtolerances(void* cvode_mem, CVEwtFn efun)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_MallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_MALLOC, __LINE__, __func__, __FILE__,
                   MSGCV_NO_MALLOC);
    return (CV_NO_MALLOC);
  }

  cv_mem->cv_itol = CV_WF;

  cv_mem->cv_user_efun = SUNTRUE;
  cv_mem->cv_efun      = efun;
  cv_mem->cv_e_data    = NULL; /* will be set to user_data in InitialSetup */

  return (CV_SUCCESS);
}